

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastShiftLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                       Vec_Int_t *vRes)

{
  int iLit0;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0x1f;
  if (nNum - 1U != 0) {
    for (; nNum - 1U >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) + 0x21;
  if ((uint)nNum < 2) {
    uVar2 = nNum;
  }
  if ((int)uVar2 < nShift) {
    uVar1 = (ulong)uVar2;
    iLit0 = pShift[uVar1];
    if (uVar2 + 1 < (uint)nShift) {
      uVar3 = uVar1 + 1;
      do {
        iLit0 = Gia_ManHashOr(pNew,iLit0,pShift[uVar3]);
        uVar3 = uVar3 + 1;
      } while ((uint)nShift != uVar3);
    }
    pShift[uVar1] = iLit0;
    nShift = uVar2 + 1;
  }
  Wlc_BlastShiftLeftInt(pNew,pNum,nNum,pShift,nShift,fSticky,vRes);
  return;
}

Assistant:

void Wlc_BlastShiftLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int nShiftMax = Abc_Base2Log(nNum);
    if ( nShiftMax < nShift )
    {
        int i, iRes = pShift[nShiftMax];
        for ( i = nShiftMax + 1; i < nShift; i++ )
            iRes = Gia_ManHashOr( pNew, iRes, pShift[i] );
        pShift[nShiftMax++] = iRes;
    }
    else 
        nShiftMax = nShift;
    Wlc_BlastShiftLeftInt( pNew, pNum, nNum, pShift, nShiftMax, fSticky, vRes );
}